

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::
ProcessScope<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessHullShaderConstantFunction(char_const*,bool&)::__0>
          (ConversionStream *this,iterator *Token,iterator ScopeEnd,TokenType OpenParenType,
          TokenType ClosingParenType,anon_class_24_3_e6290b07 *Handler)

{
  pointer pHVar1;
  Char *Message;
  undefined4 in_register_0000000c;
  char (*Args_1) [32];
  bool bVar2;
  String local_f0;
  undefined1 local_d0 [8];
  string err_1;
  string msg;
  String local_80;
  undefined1 local_60 [8];
  string err;
  uint local_38;
  uint local_34;
  int ScopeDepth;
  int StartScopeDepth;
  anon_class_24_3_e6290b07 *Handler_local;
  TokenType ClosingParenType_local;
  TokenType OpenParenType_local;
  iterator *Token_local;
  ConversionStream *this_local;
  iterator ScopeEnd_local;
  
  Args_1 = (char (*) [32])CONCAT44(in_register_0000000c,OpenParenType);
  this_local = (ConversionStream *)ScopeEnd._M_node;
  pHVar1 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar2 = pHVar1->Type == OpenParenType;
  if (bVar2) {
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  }
  local_34 = (uint)bVar2;
  local_38 = local_34;
  while (bVar2 = std::operator!=(Token,(_Self *)&this_local), bVar2) {
    pHVar1 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar1->Type == OpenParenType) {
      local_38 = local_38 + 1;
    }
    else {
      pHVar1 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if ((pHVar1->Type == ClosingParenType) &&
         (local_38 = local_38 - 1, (int)local_38 < (int)local_34)) break;
    }
    ProcessHullShaderConstantFunction::anon_class_24_3_e6290b07::operator()(Handler,Token,local_38);
  }
  if (local_34 == 1) {
    err.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      FormatString<char[38]>
                ((string *)local_60,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_80,this,Token,4);
      Args_1 = (char (*) [32])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60,(char (*) [2])0xc39489,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)local_60);
    }
    pHVar1 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar1->Type != ClosingParenType) {
      FormatString<char[26],char[32]>
                ((string *)((long)&err_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Token->Type == ClosingParenType",Args_1);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1f);
      std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
    }
  }
  else if (local_38 != 0) {
    FormatString<char[20]>((string *)local_d0,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_f0,this,Token,4)
    ;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               (char (*) [2])0xc39489,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)local_d0);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessScope(TokenListType::iterator& Token,
                                                            TokenListType::iterator  ScopeEnd,
                                                            TokenType                OpenParenType,
                                                            TokenType                ClosingParenType,
                                                            THandler&&               Handler)
{
    // The function can handle both global scope as well as local scope
    int StartScopeDepth = 0;
    if (Token->Type == OpenParenType)
    {
        // void TestPS()
        //            ^
        StartScopeDepth = 1;
        ++Token;
    }
    int ScopeDepth = StartScopeDepth;
    while (Token != ScopeEnd)
    {
        if (Token->Type == OpenParenType)
            ++ScopeDepth;
        else if (Token->Type == ClosingParenType)
        {
            --ScopeDepth;
            if (ScopeDepth < StartScopeDepth)
                break;
        }

        Handler(Token, ScopeDepth);
    }
    if (StartScopeDepth == 1)
    {
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while processing scope");
        VERIFY_EXPR(Token->Type == ClosingParenType);
    }
    else
    {
        VERIFY_PARSER_STATE(Token, ScopeDepth == 0, "Unbalanced brackets");
    }
}